

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2-arch.c
# Opt level: O3

void fill_segment_default(argon2_instance_t *instance,argon2_position_t position)

{
  block *pbVar1;
  bool bVar2;
  uint32_t uVar3;
  uint64_t *puVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  byte bVar9;
  uint uVar10;
  block zero_block;
  block input_block;
  block address_block;
  argon2_position_t local_c50;
  uint local_c3c;
  ulong local_c38;
  block local_c30;
  block local_830;
  block local_430;
  
  uVar5 = position._8_8_;
  uVar6 = position._0_8_;
  if (instance != (argon2_instance_t *)0x0) {
    uVar3 = position.pass;
    bVar9 = position.slice;
    local_c50._0_8_ = uVar6;
    local_c50._8_8_ = uVar5;
    if ((instance->type == Argon2_i) || ((instance->type == Argon2_id && uVar3 == 0) && bVar9 < 2))
    {
      uVar8 = 0;
      init_block_value(&local_c30,'\0');
      init_block_value(&local_830,'\0');
      local_830.v[0] = uVar6 & 0xffffffff;
      local_830.v[2] = uVar5 & 0xff;
      local_830.v[3] = (uint64_t)instance->memory_blocks;
      local_830.v[4] = (uint64_t)instance->passes;
      local_830.v[5] = (uint64_t)instance->type;
      bVar2 = true;
      local_830.v[1] = uVar6 >> 0x20;
      if (bVar9 == 0 && uVar3 == 0) {
        local_830.v[6] = local_830.v[6] + 1;
        fill_block(&local_c30,&local_830,&local_430,0);
        fill_block(&local_c30,&local_430,&local_430,0);
        uVar8 = 2;
      }
    }
    else {
      uVar8 = (uint)(bVar9 == 0 && uVar3 == 0) * 2;
      bVar2 = false;
    }
    if (uVar8 < instance->segment_length) {
      uVar10 = instance->lane_length;
      uVar7 = instance->segment_length * (position._8_4_ & 0xff) + position.lane * uVar10;
      local_c38 = (ulong)uVar7;
      uVar7 = uVar7 + uVar8;
      uVar7 = (-(uint)(uVar7 % uVar10 != 0) | uVar10 - 1) + uVar7;
      do {
        local_c3c = (int)local_c38 + uVar8;
        if (local_c3c % instance->lane_length == 1) {
          uVar7 = ((int)local_c38 + uVar8) - 1;
        }
        if (bVar2) {
          if ((uVar8 & 0x7f) == 0) {
            local_830.v[6] = local_830.v[6] + 1;
            fill_block(&local_c30,&local_830,&local_430,0);
            fill_block(&local_c30,&local_430,&local_430,0);
          }
          puVar4 = local_430.v + (uVar8 & 0x7f);
        }
        else {
          puVar4 = instance->memory[uVar7].v;
        }
        uVar5 = (*puVar4 >> 0x20) % (ulong)instance->lanes;
        uVar10 = 0;
        uVar6 = uVar5;
        if (local_c50.slice == '\0') {
          uVar6 = (ulong)local_c50._0_8_ >> 0x20;
        }
        if (local_c50.pass != 0) {
          uVar6 = uVar5;
        }
        local_c50.index = uVar8;
        uVar3 = index_alpha(instance,&local_c50,(uint32_t)*puVar4,
                            (uint)(uVar6 == (ulong)local_c50._0_8_ >> 0x20));
        pbVar1 = instance->memory;
        if (local_c50.pass != 0) {
          uVar10 = (uint)(instance->version != 0x10);
        }
        fill_block(pbVar1 + uVar7,pbVar1 + uVar6 * instance->lane_length + (ulong)uVar3,
                   pbVar1 + local_c3c,uVar10);
        uVar8 = uVar8 + 1;
        uVar7 = uVar7 + 1;
      } while (uVar8 < instance->segment_length);
    }
  }
  return;
}

Assistant:

void fill_segment_default(const argon2_instance_t *instance,
                          argon2_position_t position)
{
    fill_segment_64(instance, position);
}